

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
UnExemptIRCCommand::trigger
          (UnExemptIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  ulong uVar2;
  long *plVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  if (parameters._M_len == 0) {
    pcVar5 = "Error: Too Few Parameters. Syntax: unexempt <Exemption ID>";
    uVar4 = 0x3a;
  }
  else {
    uVar2 = Jupiter_strtoull_s(parameters._M_str,parameters._M_len,0,channel._M_str);
    plVar3 = (long *)RenX::ExemptionDatabase::getEntries();
    if (uVar2 < (ulong)(plVar3[1] - *plVar3 >> 3)) {
      cVar1 = RenX::ExemptionDatabase::deactivate(RenX::exemptionDatabase);
      if (cVar1 == '\0') {
        pcVar5 = "Error: Exemption not active.";
        uVar4 = 0x1c;
      }
      else {
        pcVar5 = "Exemption deactivated.";
        uVar4 = 0x16;
      }
    }
    else {
      pcVar5 = "Error: Invalid exemption ID; please find the exemption ID using \"esearch\".";
      uVar4 = 0x4a;
    }
  }
  Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,uVar4,pcVar5);
  return;
}

Assistant:

void UnExemptIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		size_t index = Jupiter::from_string<size_t>(parameters);
		if (index < RenX::exemptionDatabase->getEntries().size())
		{
			if (RenX::exemptionDatabase->deactivate(index))
				source->sendNotice(nick, "Exemption deactivated."sv);
			else
				source->sendNotice(nick, "Error: Exemption not active."sv);
		}
		else
			source->sendNotice(nick, "Error: Invalid exemption ID; please find the exemption ID using \"esearch\"."sv);
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: unexempt <Exemption ID>"sv);
}